

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_key.hpp
# Opt level: O2

data_ptr_t __thiscall
duckdb::ARTKey::CreateData<duckdb::uhugeint_t>
          (ARTKey *this,ArenaAllocator *allocator,uhugeint_t value)

{
  ulong *puVar1;
  ulong uVar2;
  
  uVar2 = value.lower;
  puVar1 = (ulong *)ArenaAllocator::Allocate((ArenaAllocator *)this,0x10);
  *puVar1 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 | (uVar2 & 0xff0000000000) >> 0x18 |
            (uVar2 & 0xff00000000) >> 8 | (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
            (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
  puVar1[1] = (ulong)allocator >> 0x38 | ((ulong)allocator & 0xff000000000000) >> 0x28 |
              ((ulong)allocator & 0xff0000000000) >> 0x18 | ((ulong)allocator & 0xff00000000) >> 8 |
              ((ulong)allocator & 0xff000000) << 8 | ((ulong)allocator & 0xff0000) << 0x18 |
              ((ulong)allocator & 0xff00) << 0x28 | (long)allocator << 0x38;
  return (data_ptr_t)puVar1;
}

Assistant:

static inline data_ptr_t CreateData(ArenaAllocator &allocator, T value) {
		auto data = allocator.Allocate(sizeof(value));
		Radix::EncodeData<T>(data, value);
		return data;
	}